

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::disconnectInterface(CommonCore *this,ActionMessage *command)

{
  bool bVar1;
  GlobalFederateId id;
  FederateState *pFVar2;
  long in_RSI;
  CommonCore *in_RDI;
  GlobalFederateId unaff_retaddr;
  FederateState *fed;
  BasicHandleInfo *handleInfo;
  ActionMessage *in_stack_00000448;
  TranslatorFederate *in_stack_00000450;
  ActionMessage *in_stack_00000558;
  FilterFederate *in_stack_00000560;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar3;
  undefined8 in_stack_ffffffffffffffc8;
  GlobalFederateId local_28;
  BaseType local_24;
  GlobalFederateId local_20;
  undefined4 local_1c;
  BasicHandleInfo *local_18;
  long local_10;
  CommonCore *this_00;
  
  local_1c = *(undefined4 *)(in_RSI + 0xc);
  local_10 = in_RSI;
  this_00 = in_RDI;
  local_18 = HandleManager::getHandleInfo
                       ((HandleManager *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        (InterfaceHandle)(BaseType)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  if ((local_18 != (BasicHandleInfo *)0x0) &&
     (bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::ConnectionFlags>
                        ((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                          *)local_18,disconnected_flag), !bVar1)) {
    setActionFlag<helics::BasicHandleInfo,helics::ConnectionFlags>(local_18,disconnected_flag);
    local_20 = BasicHandleInfo::getFederateId(local_18);
    local_24 = (BaseType)std::atomic<helics::GlobalFederateId>::load(&in_RDI->filterFedID,seq_cst);
    bVar1 = GlobalFederateId::operator==(&local_20,(GlobalFederateId)local_24);
    if (bVar1) {
      if (in_RDI->filterFed != (FilterFederate *)0x0) {
        FilterFederate::handleMessage(in_stack_00000560,in_stack_00000558);
      }
    }
    else {
      local_28 = BasicHandleInfo::getFederateId(local_18);
      id = std::atomic<helics::GlobalFederateId>::load(&in_RDI->translatorFedID,seq_cst);
      bVar1 = GlobalFederateId::operator==(&local_28,id);
      if (bVar1) {
        if (in_RDI->translatorFed != (TranslatorFederate *)0x0) {
          TranslatorFederate::handleMessage(in_stack_00000450,in_stack_00000448);
        }
      }
      else if (local_18->handleType != FILTER) {
        uVar3 = *(undefined4 *)(local_10 + 8);
        pFVar2 = getFederateCore(this_00,unaff_retaddr);
        if (pFVar2 != (FederateState *)0x0) {
          FederateState::addAction
                    ((FederateState *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),
                     (ActionMessage *)in_RDI);
        }
      }
    }
    bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::InterfaceFlags>
                      ((_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                        *)local_18,nameless_interface_flag);
    if (!bVar1) {
      (*(in_RDI->super_Core)._vptr_Core[0x6b])(in_RDI,0,local_10);
    }
  }
  return;
}

Assistant:

void CommonCore::disconnectInterface(ActionMessage& command)
{
    auto* handleInfo = loopHandles.getHandleInfo(command.source_handle);
    if (handleInfo == nullptr) {
        return;
    }
    if (checkActionFlag(*handleInfo, disconnected_flag)) {
        return;
    }
    setActionFlag(*handleInfo, disconnected_flag);
    if (handleInfo->getFederateId() == filterFedID.load()) {
        if (filterFed != nullptr) {
            filterFed->handleMessage(command);
        }
    } else if (handleInfo->getFederateId() == translatorFedID.load()) {
        if (translatorFed != nullptr) {
            translatorFed->handleMessage(command);
        }
    } else {
        if (handleInfo->handleType != InterfaceType::FILTER) {
            auto* fed = getFederateCore(command.source_id);
            if (fed != nullptr) {
                fed->addAction(command);
            }
        }
    }

    if (!checkActionFlag(*handleInfo, nameless_interface_flag)) {
        transmit(parent_route_id, command);
    }
}